

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  
  fVar1 = (window->Pos).x;
  fVar2 = (window->Pos).y;
  fVar4 = (window->Size).x + fVar1;
  fVar6 = (window->Size).y + fVar2;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar4 = fVar4 + -1.0;
    fVar6 = fVar6 + -1.0;
  }
  switch(border_n) {
  case 0:
    fVar3 = fVar1 - thickness;
    fVar5 = fVar2 + perp_padding;
    fVar4 = fVar1 + thickness;
    fVar6 = fVar6 - perp_padding;
    break;
  case 1:
    fVar3 = fVar4 - thickness;
    fVar5 = fVar2 + perp_padding;
    fVar4 = thickness + fVar4;
    fVar6 = fVar6 - perp_padding;
    break;
  case 2:
    fVar3 = fVar1 + perp_padding;
    fVar4 = fVar4 - perp_padding;
    fVar5 = fVar2 - thickness;
    fVar6 = fVar2 + thickness;
    break;
  case 3:
    fVar3 = fVar1 + perp_padding;
    fVar5 = fVar6 - thickness;
    fVar4 = fVar4 - perp_padding;
    fVar6 = fVar6 + thickness;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x14e4,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
  }
  IVar7.Max.y = fVar6;
  IVar7.Max.x = fVar4;
  IVar7.Min.y = fVar5;
  IVar7.Min.x = fVar3;
  return IVar7;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f)
        rect.Max -= ImVec2(1, 1);
    if (border_n == ImGuiDir_Left)  { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); }
    if (border_n == ImGuiDir_Right) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); }
    if (border_n == ImGuiDir_Up)    { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    }
    if (border_n == ImGuiDir_Down)  { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    }
    IM_ASSERT(0);
    return ImRect();
}